

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageLessEqual(StackInterpreter *this)

{
  StackMemory *pSVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  size_t sVar4;
  Oop selector;
  uint uVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  pSVar1 = this->stack;
  puVar2 = (ulong *)(pSVar1->stackFrame).stackPointer;
  puVar6 = (undefined8 *)*puVar2;
  puVar3 = (undefined8 *)puVar2[1];
  uVar5 = (uint)puVar6;
  uVar7 = (uint)puVar3;
  if ((uVar5 & uVar7 & 1) == 0) {
    if ((uVar5 & 7) == 2 && (uVar7 & 7) == 2) {
      sVar4 = this->pc;
      this->pc = sVar4 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar4);
      if ((int)((ulong)puVar3 >> 3) <= (int)((ulong)puVar6 >> 3)) {
LAB_001472d2:
        puVar6 = &TrueObject;
        goto LAB_001472d9;
      }
    }
    else {
      if ((((((ulong)puVar3 & 1) == 0) && ((uVar7 & 6) != 4)) &&
          ((((ulong)puVar3 & 6) != 0 || ((uint)((ulong)*puVar3 >> 0x2a) != 0x22)))) ||
         (((((ulong)puVar6 & 1) == 0 && ((uVar5 & 6) != 4)) &&
          ((((ulong)puVar6 & 6) != 0 || ((uint)((ulong)*puVar6 >> 0x2a) != 0x22)))))) {
        selector = VMContext::getSpecialMessageSelector(this->context,LessEqual);
        sendSelectorArgumentCount(this,selector,1,false);
        return;
      }
      sVar4 = this->pc;
      this->pc = sVar4 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar4);
      (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 2);
      if (((ulong)puVar3 & 1) == 0) {
        if ((uVar7 & 6) == 4) {
          uVar8 = ((ulong)puVar3 >> 3) + 0x7000000000000000;
          dVar10 = (double)(uVar8 >> 1 | (ulong)((uVar8 & 1) != 0) << 0x3f);
        }
        else {
          if ((((ulong)puVar3 & 6) != 0) || ((uint)((ulong)*puVar3 >> 0x2a) != 0x22))
          goto LAB_0014741e;
          dVar10 = (double)puVar3[1];
        }
      }
      else {
        dVar10 = (double)((long)puVar3 >> 1);
      }
      if (((ulong)puVar6 & 1) == 0) {
        if ((uVar5 & 6) == 4) {
          uVar8 = ((ulong)puVar6 >> 3) + 0x7000000000000000;
          dVar9 = (double)(uVar8 >> 1 | (ulong)((uVar8 & 1) != 0) << 0x3f);
        }
        else {
          if ((((ulong)puVar6 & 6) != 0) || ((uint)((ulong)*puVar6 >> 0x2a) != 0x22)) {
LAB_0014741e:
            __assert_fail("isFloatOrInt()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                          ,0x21e,"double Lodtalk::Oop::decodeFloatOrInt() const");
          }
          dVar9 = (double)puVar6[1];
        }
      }
      else {
        dVar9 = (double)((long)puVar6 >> 1);
      }
      if (dVar10 <= dVar9) goto LAB_001472d2;
    }
  }
  else {
    sVar4 = this->pc;
    this->pc = sVar4 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar4);
    if ((long)puVar3 >> 1 <= (long)puVar6 >> 1) goto LAB_001472d2;
  }
  puVar6 = &FalseObject;
LAB_001472d9:
  (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 1);
  puVar2[1] = (ulong)puVar6;
  return;
}

Assistant:

void interpretSpecialMessageLessEqual()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            pushBoolean(ia <= ib);
        }
        else if(a.isCharacter() && b.isCharacter())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ca = a.decodeCharacter();
            auto cb = b.decodeCharacter();
            pushBoolean(ca <= cb);
        }
        else if(a.isFloatOrInt() && b.isFloatOrInt())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto fa = a.decodeFloatOrInt();
            auto fb = b.decodeFloatOrInt();
            pushBoolean(fa <= fb);
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::LessEqual, 1);
        }
    }